

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

path * __thiscall
boost::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  iterator itr_2;
  iterator itr;
  pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> mm;
  iterator itr_1;
  iterator itr_3;
  iterator local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  path *local_190;
  size_type local_188;
  iterator local_180;
  pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator> local_150;
  iterator local_f0;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  path *local_a0;
  size_type local_98;
  iterator local_90;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  path *local_40;
  size_type local_38;
  
  begin(&local_180,this);
  local_1b0 = &local_1a0;
  local_1a8 = 0;
  local_1a0 = 0;
  local_188 = (this->m_pathname)._M_string_length;
  local_190 = this;
  begin(&local_f0,base);
  local_b8 = 0;
  local_b0 = 0;
  local_98 = (base->m_pathname)._M_string_length;
  local_c0 = &local_b0;
  local_a0 = base;
  if ((local_180.m_path_ptr != local_190) || (local_180.m_pos != local_188)) {
    do {
      if (((local_f0.m_path_ptr == local_a0) && (local_f0.m_pos == local_98)) ||
         (iVar2 = compare(&local_180.m_element,&local_f0.m_element), iVar2 != 0)) break;
      m_path_iterator_increment(&local_180);
      m_path_iterator_increment(&local_f0);
    } while ((local_180.m_path_ptr != local_190) || (local_180.m_pos != local_188));
  }
  std::pair<boost::filesystem::path::iterator,_boost::filesystem::path::iterator>::
  pair<boost::filesystem::path::iterator_&,_boost::filesystem::path::iterator_&,_true>
            (&local_150,&local_180,&local_f0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.m_element.m_pathname._M_dataplus._M_p != &local_f0.m_element.m_pathname.field_2) {
    operator_delete(local_f0.m_element.m_pathname._M_dataplus._M_p,
                    local_f0.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_element.m_pathname._M_dataplus._M_p != &local_180.m_element.m_pathname.field_2)
  {
    operator_delete(local_180.m_element.m_pathname._M_dataplus._M_p,
                    local_180.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  begin(&local_1e8,this);
  if (local_1e8.m_pos == local_150.first.m_pos && local_150.first.m_path_ptr == local_1e8.m_path_ptr
     ) {
    begin(&local_90,base);
    bVar3 = local_90.m_pos == local_150.second.m_pos &&
            local_150.second.m_path_ptr == local_90.m_path_ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_element.m_pathname._M_dataplus._M_p != &local_90.m_element.m_pathname.field_2)
    {
      operator_delete(local_90.m_element.m_pathname._M_dataplus._M_p,
                      local_90.m_element.m_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = false;
  }
  paVar1 = &local_1e8.m_element.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_element.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8.m_element.m_pathname._M_dataplus._M_p,
                    CONCAT71(local_1e8.m_element.m_pathname.field_2._M_allocated_capacity._1_7_,
                             local_1e8.m_element.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if (bVar3) {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  }
  else {
    local_1e8.m_pos = (this->m_pathname)._M_string_length;
    if (local_1e8.m_pos == local_150.first.m_pos && local_150.first.m_path_ptr == this) {
      local_60 = local_50;
      local_58 = 0;
      local_50[0] = 0;
      local_38 = (base->m_pathname)._M_string_length;
      bVar3 = local_38 == local_150.second.m_pos && local_150.second.m_path_ptr == base;
      local_40 = base;
    }
    else {
      bVar3 = false;
    }
    local_1e8.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
    local_1e8.m_element.m_pathname._M_string_length = 0;
    if (bVar3) {
      local_1e8.m_element.m_pathname._M_dataplus._M_p = (pointer)paVar1;
      local_1e8.m_path_ptr = this;
      detail::dot_path();
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_pathname).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,
                 detail::dot_path::dot_pth.m_pathname._M_dataplus._M_p,
                 detail::dot_path::dot_pth.m_pathname._M_dataplus._M_p +
                 detail::dot_path::dot_pth.m_pathname._M_string_length);
    }
    else {
      local_1b8 = &(__return_storage_ptr__->m_pathname).field_2;
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)local_1b8;
      (__return_storage_ptr__->m_pathname)._M_string_length = 0;
      (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
      while( true ) {
        local_1e8.m_element.m_pathname._M_string_length = 0;
        local_1e8.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
        if ((local_150.second.m_path_ptr == base) &&
           (local_150.second.m_pos == (base->m_pathname)._M_string_length)) break;
        local_1e8.m_element.m_pathname._M_dataplus._M_p = (pointer)paVar1;
        local_1e8.m_path_ptr = base;
        detail::dot_dot_path();
        operator/=(__return_storage_ptr__,&detail::dot_dot_path::dot_dot);
        m_path_iterator_increment(&local_150.second);
      }
      while( true ) {
        local_1e8.m_element.m_pathname._M_string_length = 0;
        local_1e8.m_element.m_pathname.field_2._M_local_buf[0] = '\0';
        if ((local_150.first.m_path_ptr == this) &&
           (local_1e8.m_element.m_pathname._M_dataplus._M_p = (pointer)paVar1,
           local_1e8.m_path_ptr = this, local_150.first.m_pos == (this->m_pathname)._M_string_length
           )) break;
        local_1e8.m_element.m_pathname._M_dataplus._M_p = (pointer)paVar1;
        local_1e8.m_path_ptr = this;
        operator/=(__return_storage_ptr__,(path *)&local_150);
        m_path_iterator_increment(&local_150.first);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.second.m_element.m_pathname._M_dataplus._M_p !=
      &local_150.second.m_element.m_pathname.field_2) {
    operator_delete(local_150.second.m_element.m_pathname._M_dataplus._M_p,
                    local_150.second.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.first.m_element.m_pathname._M_dataplus._M_p !=
      &local_150.first.m_element.m_pathname.field_2) {
    operator_delete(local_150.first.m_element.m_pathname._M_dataplus._M_p,
                    local_150.first.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::lexically_relative(const path& base) const
  {
    std::pair<path::iterator, path::iterator> mm
      = detail::mismatch(begin(), end(), base.begin(), base.end());
    if (mm.first == begin() && mm.second == base.begin())
      return path();
    if (mm.first == end() && mm.second == base.end())
      return detail::dot_path();
    path tmp;
    for (; mm.second != base.end(); ++mm.second)
      tmp /= detail::dot_dot_path();
    for (; mm.first != end(); ++mm.first)
      tmp /= *mm.first;
    return tmp;
  }